

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectionalAtom.cpp
# Opt level: O1

void __thiscall OpenMD::DirectionalAtom::setA(DirectionalAtom *this,RotMat3x3d *a,int snapshotNo)

{
  undefined8 *puVar1;
  SnapshotManager *pSVar2;
  undefined8 uVar3;
  bool bVar4;
  uint i;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  double *pdVar7;
  undefined4 extraout_var_01;
  uint i_1;
  double (*padVar8) [3];
  double (*padVar9) [3];
  long lVar10;
  double *pdVar11;
  Mat3x3d *pMVar12;
  uint j_3;
  uint k_1;
  Mat3x3d *pMVar13;
  uint k;
  long lVar14;
  double dVar15;
  Vector<double,_3U> result_1;
  SquareMatrix3<double> result_2;
  RotMat3x3d atrans;
  double local_108 [10];
  double local_b8 [10];
  double local_68 [10];
  
  iVar5 = (*((this->super_Atom).super_StuntDouble.snapshotMan_)->_vptr_SnapshotManager[4])();
  padVar8 = (double (*) [3])
            ((long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x48 +
            *(long *)(CONCAT44(extraout_var,iVar5) + 0x48 +
                     (this->super_Atom).super_StuntDouble.storage_));
  if ((RotMat3x3d *)padVar8 != a) {
    lVar6 = 0;
    padVar9 = (double (*) [3])a;
    do {
      lVar10 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar8)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar10] =
             (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).data_[0]
             [lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar6 = lVar6 + 1;
      padVar8 = padVar8 + 1;
      padVar9 = padVar9 + 1;
    } while (lVar6 != 3);
  }
  bVar4 = AtomType::isMultipole((this->super_Atom).atomType_);
  if (bVar4) {
    pdVar7 = local_68;
    local_68[6] = 0.0;
    local_68[7] = 0.0;
    local_68[4] = 0.0;
    local_68[5] = 0.0;
    local_68[2] = 0.0;
    local_68[3] = 0.0;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[8] = 0.0;
    lVar6 = 0;
    padVar8 = (double (*) [3])a;
    do {
      lVar10 = 0;
      pdVar11 = pdVar7;
      do {
        *pdVar11 = (((SquareMatrix<double,_3> *)*padVar8)->super_RectMatrix<double,_3U,_3U>).data_
                   [0][lVar10];
        lVar10 = lVar10 + 1;
        pdVar11 = pdVar11 + 3;
      } while (lVar10 != 3);
      lVar6 = lVar6 + 1;
      pdVar7 = pdVar7 + 1;
      padVar8 = padVar8 + 1;
    } while (lVar6 != 3);
    bVar4 = AtomType::isDipole((this->super_Atom).atomType_);
    if (bVar4) {
      local_108[0] = 0.0;
      local_108[1] = 0.0;
      local_108[2] = 0.0;
      pdVar7 = local_68;
      lVar6 = 0;
      do {
        dVar15 = local_108[lVar6];
        lVar10 = 0;
        do {
          dVar15 = dVar15 + pdVar7[lVar10] * (this->dipole_).super_Vector<double,_3U>.data_[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        local_108[lVar6] = dVar15;
        lVar6 = lVar6 + 1;
        pdVar7 = pdVar7 + 3;
      } while (lVar6 != 3);
      pSVar2 = (this->super_Atom).super_StuntDouble.snapshotMan_;
      iVar5 = (*pSVar2->_vptr_SnapshotManager[4])(pSVar2,(ulong)(uint)snapshotNo);
      lVar10 = (long)(this->super_Atom).super_StuntDouble.localIndex_;
      lVar6 = *(long *)(CONCAT44(extraout_var_00,iVar5) + 0xf0 +
                       (this->super_Atom).super_StuntDouble.storage_);
      pdVar7 = (double *)(lVar6 + lVar10 * 0x18);
      *pdVar7 = local_108[0];
      pdVar7[1] = local_108[1];
      *(double *)(lVar6 + 0x10 + lVar10 * 0x18) = local_108[2];
    }
    bVar4 = AtomType::isQuadrupole((this->super_Atom).atomType_);
    if (bVar4) {
      local_b8[6] = 0.0;
      local_b8[7] = 0.0;
      local_b8[4] = 0.0;
      local_b8[5] = 0.0;
      local_b8[2] = 0.0;
      local_b8[3] = 0.0;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_b8[8] = 0.0;
      pdVar7 = local_68;
      lVar6 = 0;
      do {
        lVar10 = 0;
        pMVar12 = &this->quadrupole_;
        do {
          dVar15 = local_b8[lVar6 * 3 + lVar10];
          lVar14 = 0;
          pMVar13 = pMVar12;
          do {
            dVar15 = dVar15 + pdVar7[lVar14] *
                              (pMVar13->super_SquareMatrix<double,_3>).
                              super_RectMatrix<double,_3U,_3U>.data_[0][0];
            lVar14 = lVar14 + 1;
            pMVar13 = (Mat3x3d *)
                      ((pMVar13->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                       data_ + 1);
          } while (lVar14 != 3);
          local_b8[lVar6 * 3 + lVar10] = dVar15;
          lVar10 = lVar10 + 1;
          pMVar12 = (Mat3x3d *)
                    ((pMVar12->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                     [0] + 1);
        } while (lVar10 != 3);
        lVar6 = lVar6 + 1;
        pdVar7 = pdVar7 + 3;
      } while (lVar6 != 3);
      local_108[6] = 0.0;
      local_108[7] = 0.0;
      local_108[4] = 0.0;
      local_108[5] = 0.0;
      local_108[2] = 0.0;
      local_108[3] = 0.0;
      local_108[0] = 0.0;
      local_108[1] = 0.0;
      local_108[8] = 0.0;
      pdVar7 = local_b8;
      lVar6 = 0;
      do {
        lVar10 = 0;
        padVar8 = (double (*) [3])a;
        do {
          dVar15 = local_108[lVar6 * 3 + lVar10];
          lVar14 = 0;
          padVar9 = padVar8;
          do {
            dVar15 = dVar15 + pdVar7[lVar14] *
                              (((SquareMatrix<double,_3> *)*padVar9)->
                              super_RectMatrix<double,_3U,_3U>).data_[0][0];
            lVar14 = lVar14 + 1;
            padVar9 = padVar9 + 1;
          } while (lVar14 != 3);
          local_108[lVar6 * 3 + lVar10] = dVar15;
          lVar10 = lVar10 + 1;
          padVar8 = (double (*) [3])(*padVar8 + 1);
        } while (lVar10 != 3);
        lVar6 = lVar6 + 1;
        pdVar7 = pdVar7 + 3;
      } while (lVar6 != 3);
      pSVar2 = (this->super_Atom).super_StuntDouble.snapshotMan_;
      iVar5 = (*pSVar2->_vptr_SnapshotManager[4])(pSVar2,(ulong)(uint)snapshotNo);
      lVar10 = (long)(this->super_Atom).super_StuntDouble.localIndex_ * 0x48 +
               *(long *)(CONCAT44(extraout_var_01,iVar5) + 0x108 +
                        (this->super_Atom).super_StuntDouble.storage_);
      lVar6 = 0;
      do {
        *(undefined8 *)(lVar10 + 0x10 + lVar6) = *(undefined8 *)((long)local_108 + lVar6 + 0x10);
        uVar3 = *(undefined8 *)((long)local_108 + lVar6 + 8);
        puVar1 = (undefined8 *)(lVar10 + lVar6);
        *puVar1 = *(undefined8 *)((long)local_108 + lVar6);
        puVar1[1] = uVar3;
        lVar6 = lVar6 + 0x18;
      } while (lVar6 != 0x48);
    }
  }
  return;
}

Assistant:

void DirectionalAtom::setA(const RotMat3x3d& a, int snapshotNo) {
    ((snapshotMan_->getSnapshot(snapshotNo))->*storage_).aMat[localIndex_] = a;

    if (atomType_->isMultipole()) {
      RotMat3x3d atrans = a.transpose();

      if (atomType_->isDipole()) {
        ((snapshotMan_->getSnapshot(snapshotNo))->*storage_)
            .dipole[localIndex_] = atrans * dipole_;
      }

      if (atomType_->isQuadrupole()) {
        ((snapshotMan_->getSnapshot(snapshotNo))->*storage_)
            .quadrupole[localIndex_] = atrans * quadrupole_ * a;
      }
    }
  }